

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O1

void linfini2(mcmcxdef *mctx,linfdef *linf,char *filename,int flen,osfildef *fp,int new_line_records
             )

{
  code *pcVar1;
  
  (linf->linflin).lingetp = linfget;
  (linf->linflin).linclsp = linfcls;
  (linf->linflin).linppos = linfppos;
  pcVar1 = linfglop2;
  if (new_line_records == 0) {
    pcVar1 = linfglop;
  }
  (linf->linflin).linglop = pcVar1;
  (linf->linflin).linwrtp = linfwrt;
  (linf->linflin).lincmpp = linfcmp;
  (linf->linflin).linactp = linfact;
  (linf->linflin).lindisp = linfdis;
  (linf->linflin).lintellp = linftell;
  (linf->linflin).linseekp = linfseek;
  (linf->linflin).linreadp = linfread;
  (linf->linflin).linpaddp = linfpadd;
  (linf->linflin).linqtopp = linfqtop;
  (linf->linflin).lingetsp = linfgets;
  (linf->linflin).linnamp = linfnam;
  (linf->linflin).linlnump = linflnum;
  (linf->linflin).linfindp = linffind;
  (linf->linflin).lingotop = linfgoto;
  (linf->linflin).linofsp = linfofs;
  (linf->linflin).linrenp = linfren;
  (linf->linflin).lindelp = linfdelnum;
  (linf->linflin).linbuf = linf->linfbuf;
  (linf->linflin).linflg = 0;
  memcpy(linf->linfnam,filename,(long)flen);
  linf->linfnam[flen] = '\0';
  linf->linfbuf[0] = '\0';
  linf->linfbufnxt = 0;
  linf->linfnxtlen = 0;
  linf->linffp = fp;
  linf->linfnum = 0;
  (linf->linflin).linlln = 4;
  linf->linfmem = mctx;
  linf->linfcrec = 0;
  return;
}

Assistant:

void linfini2(mcmcxdef *mctx, linfdef *linf,
              char *filename, int flen, osfildef *fp, int new_line_records)
{
    /* set up method pointers */
    linf->linflin.lingetp = linfget;
    linf->linflin.linclsp = linfcls;
    linf->linflin.linppos = linfppos;
    linf->linflin.linglop = (new_line_records ? linfglop2 : linfglop);
    linf->linflin.linwrtp = linfwrt;
    linf->linflin.lincmpp = linfcmp;
    linf->linflin.linactp = linfact;
    linf->linflin.lindisp = linfdis;
    linf->linflin.lintellp = linftell;
    linf->linflin.linseekp = linfseek;
    linf->linflin.linreadp = linfread;
    linf->linflin.linpaddp = linfpadd;
    linf->linflin.linqtopp = linfqtop;
    linf->linflin.lingetsp = linfgets;
    linf->linflin.linnamp = linfnam;
    linf->linflin.linlnump = linflnum;
    linf->linflin.linfindp = linffind;
    linf->linflin.lingotop = linfgoto;
    linf->linflin.linofsp = linfofs;
    linf->linflin.linrenp = linfren;
    linf->linflin.lindelp = linfdelnum;

    /* set up instance data */
    linf->linflin.linbuf = linf->linfbuf;
    linf->linflin.linflg = 0;
    memcpy(linf->linfnam, filename, (size_t)flen);
    linf->linfnam[flen] = '\0';
    linf->linfbuf[0] = '\0';
    linf->linfbufnxt = 0;
    linf->linfnxtlen = 0;
    linf->linffp = fp;
    linf->linfnum = 0;
    linf->linflin.linlln = 4;     /* OPCLINE operand is seek offset in file */
    linf->linfmem = mctx;                    /* save memory manager context */
    linf->linfcrec = 0;                  /* no debugger records written yet */
}